

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>
               (long param_1,int param_2)

{
  undefined4 uVar1;
  bool bVar2;
  Lit tmp;
  int best_i;
  int j;
  int i;
  LessThan_default<Minisat::Lit> *in_stack_ffffffffffffffc8;
  Lit in_stack_ffffffffffffffd0;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  for (local_18 = 0; local_18 < param_2 + -1; local_18 = local_18 + 1) {
    local_20 = local_18;
    local_1c = local_18;
    while (local_1c = local_1c + 1, local_1c < param_2) {
      bVar2 = LessThan_default<Minisat::Lit>::operator()
                        (in_stack_ffffffffffffffc8,(Lit)*(int *)(param_1 + (long)local_20 * 4),
                         in_stack_ffffffffffffffd0);
      if (bVar2) {
        local_20 = local_1c;
      }
    }
    uVar1 = *(undefined4 *)(param_1 + (long)local_18 * 4);
    *(undefined4 *)(param_1 + (long)local_18 * 4) = *(undefined4 *)(param_1 + (long)local_20 * 4);
    *(undefined4 *)(param_1 + (long)local_20 * 4) = uVar1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}